

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSTSHarness.cpp
# Opt level: O0

int main(int argC,char **argV)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  long lVar7;
  XSTSHarnessHandlers *pXVar8;
  ostream *poVar9;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  ErrorHandler *local_168;
  ContentHandler *local_150;
  DTDHandler *local_108;
  StrX local_e0;
  ulong local_d8;
  unsigned_long duration;
  unsigned_long endMillis;
  OutOfMemoryException *anon_var_0;
  XMLException *e;
  unsigned_long startMillis;
  XSTSHarnessHandlers *pXStack_a0;
  bool errorOccurred;
  BaseHarnessHandlers *handler;
  XMLCh *uri;
  XMLCh *uniFile;
  RootExtractor rootExtractor;
  char *xmlFile;
  SAX2XMLReader *parser;
  int argInd;
  XMLException *toCatch;
  char **argV_local;
  int argC_local;
  
  if (argC < 2) {
    usage();
    argV_local._4_4_ = 1;
  }
  else {
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
    parser._4_4_ = 1;
    while ((parser._4_4_ < argC && (*argV[parser._4_4_] == '-'))) {
      iVar2 = strcmp(argV[parser._4_4_],"-?");
      if (iVar2 == 0) {
        usage();
        return 2;
      }
      iVar2 = strncmp(argV[parser._4_4_],"-scanner=",9);
      if (iVar2 == 0) {
        g_scanner = (XMLCh *)xercesc_4_0::XMLString::transcode
                                       (argV[parser._4_4_] + 9,
                                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cout,"Unknown option \'");
        poVar9 = std::operator<<(poVar9,argV[parser._4_4_]);
        poVar9 = std::operator<<(poVar9,"\', ignoring it\n");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
      parser._4_4_ = parser._4_4_ + 1;
    }
    if (parser._4_4_ == argC + -1) {
      plVar6 = (long *)xercesc_4_0::XMLReaderFactory::createXMLReader
                                 (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                                  (XMLGrammarPool *)0x0);
      (**(code **)(*plVar6 + 0x60))(plVar6,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpaces,1);
      (**(code **)(*plVar6 + 0x60))(plVar6,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,0);
      rootExtractor._48_8_ = argV[parser._4_4_];
      RootExtractor::RootExtractor((RootExtractor *)&uniFile);
      local_108 = (DTDHandler *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x88) {
        local_108 = &rootExtractor.super_DefaultHandler.super_DTDHandler;
      }
      (**(code **)(*plVar6 + 0x40))(plVar6,local_108);
      (**(code **)(*plVar6 + 0x80))(plVar6,rootExtractor._48_8_);
      uri = (XMLCh *)xercesc_4_0::XMLString::transcode
                               ((char *)rootExtractor._48_8_,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      lVar7 = xercesc_4_0::XMLString::stringLen((char *)rootExtractor._48_8_);
      uVar11 = lVar7 + 9;
      uVar12 = uVar11 * 2;
      if (CARRY8(uVar11,uVar11)) {
        uVar12 = 0xffffffffffffffff;
      }
      handler = (BaseHarnessHandlers *)operator_new__(uVar12);
      xercesc_4_0::XMLString::fixURI(uri,(wchar16 *)handler);
      pXStack_a0 = (XSTSHarnessHandlers *)0x0;
      bVar1 = RootExtractor::isXMLSuite((RootExtractor *)&uniFile);
      if (bVar1) {
        pXVar8 = (XSTSHarnessHandlers *)operator_new(0x120);
        XMLHarnessHandlers::XMLHarnessHandlers
                  ((XMLHarnessHandlers *)pXVar8,(XMLCh *)handler,g_scanner);
        pXStack_a0 = pXVar8;
      }
      else {
        pXVar8 = (XSTSHarnessHandlers *)operator_new(0x3e0);
        XSTSHarnessHandlers::XSTSHarnessHandlers(pXVar8,(XMLCh *)handler,g_scanner);
        pXStack_a0 = pXVar8;
      }
      xercesc_4_0::XMLString::release(&uri,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      if (handler != (BaseHarnessHandlers *)0x0) {
        operator_delete__(handler);
      }
      local_150 = (ContentHandler *)0x0;
      if (pXStack_a0 != (XSTSHarnessHandlers *)0x0) {
        local_150 = &(pXStack_a0->super_BaseHarnessHandlers).super_DefaultHandler.
                     super_ContentHandler;
      }
      (**(code **)(*plVar6 + 0x40))(plVar6,local_150);
      local_168 = (ErrorHandler *)0x0;
      if (pXStack_a0 != (XSTSHarnessHandlers *)0x0) {
        local_168 = &(pXStack_a0->super_BaseHarnessHandlers).super_DefaultHandler.super_ErrorHandler
        ;
      }
      (**(code **)(*plVar6 + 0x58))(plVar6,local_168);
      startMillis._7_1_ = 0;
      e = (XMLException *)xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      (**(code **)(*plVar6 + 0x80))(plVar6,rootExtractor._48_8_);
      duration = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      local_d8 = duration - (long)e;
      bVar1 = BaseHarnessHandlers::getSawErrors(&pXStack_a0->super_BaseHarnessHandlers);
      if (bVar1) {
        startMillis._7_1_ = 1;
      }
      poVar9 = std::operator<<((ostream *)&std::cout,"Scanner: ");
      StrX::StrX(&local_e0,g_scanner);
      poVar9 = operator<<(poVar9,&local_e0);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      StrX::~StrX(&local_e0);
      poVar9 = std::operator<<((ostream *)&std::cout,"  Total tests: ");
      uVar3 = BaseHarnessHandlers::getTotalTests(&pXStack_a0->super_BaseHarnessHandlers);
      pvVar10 = (void *)std::ostream::operator<<(poVar9,uVar3);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      poVar9 = std::operator<<((ostream *)&std::cout,"  Failed tests: ");
      uVar3 = BaseHarnessHandlers::getFailedTests(&pXStack_a0->super_BaseHarnessHandlers);
      pvVar10 = (void *)std::ostream::operator<<(poVar9,uVar3);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      poVar9 = std::operator<<((ostream *)&std::cout,"  Success rate: ");
      uVar3 = BaseHarnessHandlers::getTotalTests(&pXStack_a0->super_BaseHarnessHandlers);
      uVar4 = BaseHarnessHandlers::getFailedTests(&pXStack_a0->super_BaseHarnessHandlers);
      uVar5 = BaseHarnessHandlers::getTotalTests(&pXStack_a0->super_BaseHarnessHandlers);
      poVar9 = (ostream *)
               std::ostream::operator<<(poVar9,((double)(uVar3 - uVar4) / (double)uVar5) * 100.0);
      poVar9 = std::operator<<(poVar9,"%");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cout,"  Duration: ");
      if (60000 < local_d8) {
        poVar9 = (ostream *)std::ostream::operator<<(&std::cout,local_d8 / 60000);
        std::operator<<(poVar9,":");
        local_d8 = local_d8 % 60000;
      }
      if (local_d8 / 1000 < 10) {
        std::operator<<((ostream *)&std::cout,"0");
      }
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,local_d8 / 1000);
      poVar9 = std::operator<<(poVar9,".");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,local_d8 % 1000);
      std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
      if (plVar6 != (long *)0x0) {
        (**(code **)(*plVar6 + 8))();
      }
      if (pXStack_a0 != (XSTSHarnessHandlers *)0x0) {
        (*(pXStack_a0->super_BaseHarnessHandlers).super_DefaultHandler.super_EntityResolver.
          _vptr_EntityResolver[1])();
      }
      xercesc_4_0::XMLPlatformUtils::Terminate();
      if ((startMillis._7_1_ & 1) == 0) {
        argV_local._4_4_ = 0;
      }
      else {
        argV_local._4_4_ = 4;
      }
      RootExtractor::~RootExtractor((RootExtractor *)&uniFile);
    }
    else {
      usage();
      argV_local._4_4_ = 1;
    }
  }
  return argV_local._4_4_;
}

Assistant:

int main(int argC, char* argV[])
{

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
        std::cout << "Error during initialization! Message:\n"
            << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    int argInd;
    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 2;
        }
        // TODO: add option to generate the XML summarizing the result
        else if (!strncmp(argV[argInd], "-scanner=", 9))
        {
            g_scanner = XMLString::transcode(argV[argInd]+9);
        }
        else
        {
            std::cout << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should be only one and only one parameter left, and that
    //  should be the file name.
    //
    if (argInd != argC - 1)
    {
        usage();
        return 1;
    }

    //
    //  Create a SAX parser object.
    //
    SAX2XMLReader* parser = XMLReaderFactory::createXMLReader();
    parser->setFeature(XMLUni::fgSAX2CoreNameSpaces, true);
    parser->setFeature(XMLUni::fgSAX2CoreValidation, false);

    const char* xmlFile = argV[argInd];

    // Discover if the test suite is the XML or XMLSchema one
    RootExtractor rootExtractor;
    parser->setContentHandler(&rootExtractor);
    try
    {
        parser->parse(xmlFile);
    }
    catch (...)
    {
    }

    XMLCh* uniFile = XMLString::transcode(xmlFile);
    XMLCh* uri = new XMLCh[XMLString::stringLen(xmlFile) + 9];
    XMLString::fixURI(uniFile, uri);
    BaseHarnessHandlers* handler=NULL;
    if(rootExtractor.isXMLSuite())
    {
        // XML Test Suite
        handler=new XMLHarnessHandlers(uri, g_scanner);
    }
    else
    {
        // XMLSchema Test Suite
        handler=new XSTSHarnessHandlers(uri, g_scanner);
    }
    XMLString::release(&uniFile);
    delete [] uri;
    parser->setContentHandler(handler);
    parser->setErrorHandler(handler);

    bool errorOccurred=false;
    const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
    //
    //  Get the starting time and kick off the parse of the indicated
    //  file. Catch any exceptions that might propagate out of it.
    //
    try
    {
        parser->parse(xmlFile);
    }
    catch (const OutOfMemoryException&)
    {
        std::cout << "OutOfMemoryException" << std::endl;
        errorOccurred = true;
    }
    catch (const XMLException& e)
    {
        std::cout << "\nError during parsing: '" << xmlFile << "'\n"
            << "Exception message is:  \n"
            << StrX(e.getMessage()) << "\n" << std::endl;
        errorOccurred = true;
    }
    catch (...)
    {
        std::cout << "\nUnexpected exception during parsing: '" << xmlFile << "'\n";
        errorOccurred = true;
    }

    const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
    unsigned long duration = endMillis - startMillis;

    if (handler->getSawErrors())
        errorOccurred = true;

    std::cout << "Scanner: " << StrX(g_scanner) << std::endl;
    std::cout << "  Total tests: " << handler->getTotalTests() << std::endl;
    std::cout << "  Failed tests: " << handler->getFailedTests() << std::endl;
    std::cout << "  Success rate: " << ((double)(handler->getTotalTests()-handler->getFailedTests()))/(double)handler->getTotalTests()*100 << "%" << std::endl;
    std::cout << "  Duration: ";
    if(duration > 60000)
    {
        std::cout << duration/60000 << ":";
        duration=duration % 60000;
    }
    if(duration/1000 < 10)
        std::cout << "0";
    std::cout << duration/1000 << "." << duration % 1000 << std::endl;

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;
    delete handler;

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorOccurred)
        return 4;
    else
        return 0;

}